

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::PtexTextureBase::BaseToString_abi_cxx11_(string *__return_storage_ptr__,PtexTextureBase *this)

{
  ColorEncodingHandle *in_R9;
  
  StringPrintf<bool_const&,std::__cxx11::string_const&,pbrt::ColorEncodingHandle_const&>
            (__return_storage_ptr__,(pbrt *)"valid: %s filename: %s encoding: %s",&this->valid,
             (bool *)&this->filename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->encoding,
             in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string PtexTextureBase::BaseToString() const {
    return StringPrintf("valid: %s filename: %s encoding: %s", valid, filename, encoding);
}